

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  long in_FS_OFFSET;
  string file_name;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_9c = (int)file;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(char *)this,(allocator<char> *)&local_58);
  if ((int)file < 0) {
    std::operator+(__return_storage_ptr__,&local_38,":");
  }
  else {
    std::operator+(&local_78,&local_38,":");
    StreamableToString<int>(&local_98,&local_9c);
    std::operator+(&local_58,&local_78,&local_98);
    std::operator+(__return_storage_ptr__,&local_58,":");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}